

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

Fl_Menu_Item * __thiscall Fl_Menu_::find_item(Fl_Menu_ *this,Fl_Callback *cb)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = -1;
  lVar1 = -0x38;
  do {
    lVar4 = lVar1;
    iVar2 = size(this);
    lVar3 = lVar3 + 1;
    if (iVar2 <= lVar3) {
      return (Fl_Menu_Item *)0x0;
    }
    lVar1 = lVar4 + 0x38;
  } while (*(Fl_Callback **)((long)&this->menu_[1].callback_ + lVar4) != cb);
  return (Fl_Menu_Item *)((long)&this->menu_[1].text + lVar4);
}

Assistant:

const Fl_Menu_Item * Fl_Menu_::find_item(Fl_Callback *cb) {
  for ( int t=0; t < size(); t++ ) {
    const Fl_Menu_Item *m = menu_ + t;
    if (m->callback_==cb) {
      return m;
    }
  }
  return (const Fl_Menu_Item *)0;
}